

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O0

void __thiscall gimage::Polygon::scaleCenter(Polygon *this,double s)

{
  long lVar1;
  size_type sVar2;
  reference pvVar3;
  long *plVar4;
  vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t i_1;
  size_t i;
  double cy;
  double cx;
  ulong local_30;
  ulong local_28;
  double local_20;
  double local_18;
  
  sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                    (in_RDI);
  if (sVar2 != 0) {
    local_18 = 0.0;
    local_20 = 0.0;
    for (local_28 = 0;
        sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
                size(in_RDI), local_28 < sVar2; local_28 = local_28 + 1) {
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_28);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,0);
      local_18 = (double)*plVar4 + local_18;
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_28);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,1);
      local_20 = (double)*plVar4 + local_20;
    }
    sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                      (in_RDI);
    auVar5._8_4_ = (int)(sVar2 >> 0x20);
    auVar5._0_8_ = sVar2;
    auVar5._12_4_ = 0x45300000;
    local_18 = local_18 /
               ((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
    sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::size
                      (in_RDI);
    auVar6._8_4_ = (int)(sVar2 >> 0x20);
    auVar6._0_8_ = sVar2;
    auVar6._12_4_ = 0x45300000;
    local_20 = local_20 /
               ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
    for (local_30 = 0;
        sVar2 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
                size(in_RDI), local_30 < sVar2; local_30 = local_30 + 1) {
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_30);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,0);
      lVar1 = *plVar4;
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_30);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,0);
      *plVar4 = (long)((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) * ((double)lVar1 - local_18) +
                      local_18);
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_30);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,1);
      lVar1 = *plVar4;
      pvVar3 = std::vector<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
               operator[](in_RDI,local_30);
      plVar4 = gmath::SVector<long,_2>::operator[](pvVar3,1);
      *plVar4 = (long)((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) * ((double)lVar1 - local_20) +
                      local_20);
    }
  }
  return;
}

Assistant:

void Polygon::scaleCenter(double s)
{
  if (vertex.size() > 0)
  {
    double cx=0;
    double cy=0;

    for (size_t i=0; i<vertex.size(); i++)
    {
      cx+=vertex[i][0];
      cy+=vertex[i][1];
    }

    cx/=vertex.size();
    cy/=vertex.size();

    for (size_t i=0; i<vertex.size(); i++)
    {
      vertex[i][0]=static_cast<long>(s*(vertex[i][0]-cx)+cx);
      vertex[i][1]=static_cast<long>(s*(vertex[i][1]-cy)+cy);
    }
  }
}